

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_MetadataSerializationAndEndianness_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  size_t sVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  char *lhs_expression;
  char *rhs_expression;
  AssertHelper *this_00;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__3;
  StringIO stringio;
  string stringbuf;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char contents [24];
  AssertionResult gtest_ar;
  size_t num_bytes;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  FILE *fp;
  string kExpectedSparse;
  string kExpectedDense;
  TypeParam ht_out;
  _IO_FILE *in_stack_fffffffffffffb28;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb3c;
  hasher *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  undefined8 in_stack_fffffffffffffb58;
  Type TVar5;
  string *s;
  AssertHelper *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffb94;
  char *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba8;
  int in_stack_fffffffffffffbac;
  AssertHelper *in_stack_fffffffffffffbb0;
  AssertionResult local_3d8 [2];
  AssertionResult local_3b8;
  string local_3a8 [55];
  undefined1 local_371;
  AssertionResult local_370;
  StringIO local_360;
  string local_358;
  allocator local_321;
  string local_320 [32];
  AssertionResult local_300 [2];
  allocator local_2d9;
  string local_2d8 [32];
  AssertionResult local_2b8 [2];
  int local_298;
  undefined4 local_294;
  AssertionResult local_290 [2];
  size_t local_270;
  AssertionResult local_268;
  char local_258 [48];
  undefined8 local_228;
  AssertionResult local_220;
  size_t local_210;
  string local_208 [55];
  undefined1 local_1d1;
  AssertionResult local_1d0;
  string local_1c0 [55];
  undefined1 local_189;
  AssertionResult local_188;
  string local_178 [55];
  undefined1 local_141;
  AssertionResult local_140;
  FILE *local_130;
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [48];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_c8 [2];
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a0;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb30,
             (int)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)in_stack_fffffffffffffb30,
             (int)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_c8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
             (size_type)in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
             (key_equal *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
             (allocator_type *)in_stack_fffffffffffffb30);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,anon_var_dwarf_14da82,0x18,&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"$hu1",0x14,&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  bVar2 = google::
          HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_readwrite
                    ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_a0);
  if (bVar2) {
    local_130 = tmpfile();
    local_141 = local_130 != (FILE *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfacf36);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_140);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_178);
      testing::Message::~Message((Message *)0xfad087);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad11b);
    local_189 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_metadata<_IO_FILE>(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfad162);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_188);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_1c0);
      testing::Message::~Message((Message *)0xfad237);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad2cb);
    local_1d1 = google::
                BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::write_nopointer_data<_IO_FILE>
                          (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfad312);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_1d0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_208);
      testing::Message::~Message((Message *)0xfad3e7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad47e);
    local_210 = ftell(local_130);
    rewind(local_130);
    local_228 = 0x18;
    testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (unsigned_long *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_220);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0xfad533);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfad596);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad607);
    local_270 = fread(local_258,1,local_210,local_130);
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (unsigned_long *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (unsigned_long *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_268);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffbb0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfad6b6);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfad719);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad78a);
    local_294 = 0xffffffff;
    in_stack_fffffffffffffbac = fgetc(local_130);
    local_298 = in_stack_fffffffffffffbac;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               (int *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_290);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffba0 =
           testing::AssertionResult::failure_message((AssertionResult *)0xfad82c);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,
                 (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0xfad889);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfad8fa);
    fclose(local_130);
    in_stack_fffffffffffffb94 = (int)local_258[0];
    in_stack_fffffffffffffb98 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
    sVar1 = local_210;
    if (in_stack_fffffffffffffb94 == *in_stack_fffffffffffffb98) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d8,local_258,sVar1,&local_2d9);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        testing::AssertionResult::failure_message((AssertionResult *)0xfada57);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfadab4);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfadb1f);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_320,local_258,sVar1,&local_321);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_320);
      std::allocator<char>::~allocator((allocator<char> *)&local_321);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_300);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        in_stack_fffffffffffffb60 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xfadc3a);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb60,TVar5,
                   (char *)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50),
                   (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40
                  );
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfadc97);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfadd02);
    }
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
  bVar2 = google::
          HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)&local_a0);
  if (bVar2) {
    s = &local_358;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_360,s);
    TVar5 = (Type)((ulong)s >> 0x20);
    uVar3 = google::
            BaseHashtableInterface<google::sparse_hash_map<int,int,TransparentHasher,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::
            serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                      (&local_a0,&local_360);
    local_371 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb30,(bool *)in_stack_fffffffffffffb28,
               (type *)0xfadd95);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                 (char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffb60,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb50),
                 iVar4,(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,
                 (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
      std::__cxx11::string::~string(local_3a8);
      testing::Message::~Message((Message *)0xfade71);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xfadf08);
    lhs_expression = (char *)std::__cxx11::string::operator[]((ulong)&local_358);
    iVar4 = (int)*lhs_expression;
    rhs_expression = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
    if (iVar4 == *rhs_expression) {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        this_00 = (AssertHelper *)
                  testing::AssertionResult::failure_message((AssertionResult *)0xfadfcb);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb60,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb50)
                   ,iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper(this_00);
        testing::Message::~Message((Message *)0xfae028);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfae093);
    }
    else {
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                (lhs_expression,rhs_expression,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(iVar4,in_stack_fffffffffffffb38),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb30);
      iVar4 = (int)((ulong)lhs_expression >> 0x20);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(local_3d8);
      if (!bVar2) {
        testing::Message::Message((Message *)in_stack_fffffffffffffb60);
        testing::AssertionResult::failure_message((AssertionResult *)0xfae10b);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffb60,TVar5,(char *)CONCAT17(uVar3,in_stack_fffffffffffffb50)
                   ,iVar4,rhs_expression);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffbb0,
                   (Message *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb30);
        testing::Message::~Message((Message *)0xfae166);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xfae1d1);
    }
    std::__cxx11::string::~string((string *)&local_358);
  }
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_f8);
  google::
  HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashMap
            ((HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xfae227);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, MetadataSerializationAndEndianness) {
  TypeParam ht_out;
  string kExpectedDense(
      "\x13W\x86"
      "B\0\0\0\0\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0",
      24);
  string kExpectedSparse("$hu1\0\0\0 \0\0\0\0\0\0\0\0\0\0\0\0", 20);

  if (ht_out.supports_readwrite()) {
    auto fp = tmpfile();
    EXPECT_TRUE(fp != NULL);

    EXPECT_TRUE(ht_out.write_metadata(fp));
    EXPECT_TRUE(ht_out.write_nopointer_data(fp));

    const size_t num_bytes = ftell(fp);
    rewind(fp);
    EXPECT_LE(num_bytes, static_cast<size_t>(24));
    char contents[24];
    EXPECT_EQ(num_bytes, fread(contents, 1, num_bytes, fp));
    EXPECT_EQ(EOF, fgetc(fp));  // check we're *exactly* the right size
    fclose(fp);
    // TODO(csilvers): check type of ht_out instead of looking at the 1st byte.
    if (contents[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, string(contents, num_bytes));
    } else {
      EXPECT_EQ(kExpectedSparse, string(contents, num_bytes));
    }
  }

  // Do it again with new-style serialization.  Here we can use StringIO.
  if (ht_out.supports_serialization()) {
    string stringbuf;
    StringIO stringio(&stringbuf);
    EXPECT_TRUE(
        ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));
    if (stringbuf[0] == kExpectedDense[0]) {
      EXPECT_EQ(kExpectedDense, stringbuf);
    } else {
      EXPECT_EQ(kExpectedSparse, stringbuf);
    }
  }
}